

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O1

void __thiscall
QPDFArgParser::addChoices
          (QPDFArgParser *this,string *arg,param_arg_handler_t *handler,bool required,char **choices
          )

{
  OptionEntry *pOVar1;
  char **ppcVar2;
  char *__s;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pOVar1 = registerArg(this,arg);
  pOVar1->parameter_needed = required;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator=(&pOVar1->param_arg_handler,handler);
  __s = *choices;
  if (__s != (char *)0x0) {
    ppcVar2 = choices + 1;
    do {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&pOVar1->choices,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      __s = *ppcVar2;
      ppcVar2 = ppcVar2 + 1;
    } while (__s != (char *)0x0);
  }
  return;
}

Assistant:

void
QPDFArgParser::addChoices(
    std::string const& arg, param_arg_handler_t handler, bool required, char const** choices)
{
    OptionEntry& oe = registerArg(arg);
    oe.parameter_needed = required;
    oe.param_arg_handler = handler;
    for (char const** i = choices; *i; ++i) {
        oe.choices.insert(*i);
    }
}